

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymz280b.c
# Opt level: O0

void ymz280b_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  short sVar1;
  int iVar2;
  int iVar3;
  DEV_SMPL *__s;
  DEV_SMPL *__s_00;
  short *psVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  YMZ280BVoice *voice_00;
  short local_8a;
  int interp_sample_1;
  INT16 t;
  UINT32 j;
  UINT32 base;
  int interp_sample;
  INT32 rvol;
  INT32 lvol;
  UINT32 final_pos;
  UINT32 samples_left;
  UINT32 new_samples;
  INT32 *rdest;
  INT32 *ldest;
  INT16 *curr_data;
  INT16 curr;
  INT16 prev;
  YMZ280BVoice *voice;
  UINT32 i;
  UINT8 v;
  DEV_SMPL *racc;
  DEV_SMPL *lacc;
  ymz280b_state *chip;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *param_local;
  
  __s = *outputs;
  __s_00 = outputs[1];
  memset(__s,0,(ulong)samples << 2);
  memset(__s_00,0,(ulong)samples << 2);
  if (*(long *)((long)param + 0x2d0) != 0) {
    for (voice._7_1_ = 0; voice._7_1_ < 8; voice._7_1_ = voice._7_1_ + 1) {
      voice_00 = (YMZ280BVoice *)((long)param + (ulong)voice._7_1_ * 0x4c + 0x20);
      sVar1 = voice_00->last_sample;
      curr_data._6_2_ = voice_00->curr_sample;
      psVar4 = *(short **)((long)param + 0x2e0);
      iVar2 = voice_00->output_left;
      iVar3 = voice_00->output_right;
      if (voice_00->Muted == '\0') {
        if (((voice_00->playing == '\0') && (curr_data._6_2_ == 0)) && (sVar1 == 0)) {
          voice_00->output_pos = 0x4000;
        }
        else {
          voice._0_4_ = 0;
          while( true ) {
            bVar5 = false;
            if ((uint)voice < samples) {
              bVar5 = voice_00->output_pos < 0x4000;
            }
            if (!bVar5) break;
            iVar7 = (int)sVar1 * (0x4000 - voice_00->output_pos) +
                    (int)curr_data._6_2_ * voice_00->output_pos >> 0xe;
            __s[(uint)voice] = iVar7 * iVar2 + __s[(uint)voice];
            __s_00[(uint)voice] = iVar7 * iVar3 + __s_00[(uint)voice];
            voice_00->output_pos = voice_00->output_step + voice_00->output_pos;
            voice._0_4_ = (uint)voice + 1;
          }
          if (0x3fff < voice_00->output_pos) {
            voice_00->output_pos = voice_00->output_pos + -0x4000;
            final_pos = voice_00->output_pos + (samples - (uint)voice) * voice_00->output_step +
                        0x4000 >> 0xe;
            if (10000 < final_pos) {
              final_pos = 10000;
            }
            uVar6 = (uint)voice_00->playing << 7 | (uint)voice_00->mode;
            if (uVar6 == 0x81) {
              lvol = generate_adpcm((ymz280b_state *)param,voice_00,*(INT16 **)((long)param + 0x2e0)
                                    ,final_pos);
            }
            else if (uVar6 == 0x82) {
              lvol = generate_pcm8((ymz280b_state *)param,voice_00,*(INT16 **)((long)param + 0x2e0),
                                   final_pos);
            }
            else if (uVar6 == 0x83) {
              lvol = generate_pcm16((ymz280b_state *)param,voice_00,*(INT16 **)((long)param + 0x2e0)
                                    ,final_pos);
            }
            else {
              lvol = 0;
              memset(*(void **)((long)param + 0x2e0),0,(ulong)final_pos << 1);
            }
            if ((lvol != 0) || (voice_00->ended != '\0')) {
              voice_00->ended = '\0';
              iVar7 = final_pos - lvol;
              local_8a = curr_data._6_2_;
              if (iVar7 != 0) {
                local_8a = *(short *)(*(long *)((long)param + 0x2e0) + (ulong)(iVar7 - 1) * 2);
              }
              for (interp_sample_1 = 0; (uint)interp_sample_1 < (uint)lvol;
                  interp_sample_1 = interp_sample_1 + 1) {
                local_8a = (short)((local_8a * 0xf) / 0x10);
                *(short *)(*(long *)((long)param + 0x2e0) +
                          (ulong)(uint)(iVar7 + interp_sample_1) * 2) = local_8a;
              }
              if (iVar7 != 0) {
                voice_00->playing = '\0';
                voice_00->irq_schedule = '\x01';
              }
            }
            curr_data._4_2_ = *psVar4;
            ldest = (INT32 *)(psVar4 + 1);
            while ((uint)voice < samples) {
              while( true ) {
                bVar5 = false;
                if ((uint)voice < samples) {
                  bVar5 = voice_00->output_pos < 0x4000;
                }
                if (!bVar5) break;
                iVar7 = (int)curr_data._6_2_ * (0x4000 - voice_00->output_pos) +
                        (int)curr_data._4_2_ * voice_00->output_pos >> 0xe;
                __s[(uint)voice] = iVar7 * iVar2 + __s[(uint)voice];
                __s_00[(uint)voice] = iVar7 * iVar3 + __s_00[(uint)voice];
                voice_00->output_pos = voice_00->output_step + voice_00->output_pos;
                voice._0_4_ = (uint)voice + 1;
              }
              if (0x3fff < voice_00->output_pos) {
                voice_00->output_pos = voice_00->output_pos + -0x4000;
                curr_data._6_2_ = curr_data._4_2_;
                curr_data._4_2_ = (short)*ldest;
                ldest = (INT32 *)((long)ldest + 2);
              }
            }
            voice_00->last_sample = curr_data._6_2_;
            voice_00->curr_sample = curr_data._4_2_;
          }
        }
      }
    }
    for (voice._0_4_ = 0; (uint)voice < samples; voice._0_4_ = (uint)voice + 1) {
      (*outputs)[(uint)voice] = (*outputs)[(uint)voice] >> 8;
      outputs[1][(uint)voice] = outputs[1][(uint)voice] >> 8;
    }
    for (voice._7_1_ = 0; voice._7_1_ < 8; voice._7_1_ = voice._7_1_ + 1) {
      update_irq_state_timer_common(param,(uint)voice._7_1_);
    }
  }
  return;
}

Assistant:

static void ymz280b_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	ymz280b_state *chip = (ymz280b_state *)param;
	DEV_SMPL *lacc = outputs[0];
	DEV_SMPL *racc = outputs[1];
	UINT8 v;
	UINT32 i;

	/* clear out the accumulator */
	memset(lacc, 0, samples * sizeof(lacc[0]));
	memset(racc, 0, samples * sizeof(racc[0]));
	if (chip->mem_base == NULL)
		return;

	/* loop over voices */
	for (v = 0; v < 8; v++)
	{
		struct YMZ280BVoice *voice = &chip->voice[v];
		INT16 prev = voice->last_sample;
		INT16 curr = voice->curr_sample;
		INT16 *curr_data = chip->scratch;
		INT32 *ldest = lacc;
		INT32 *rdest = racc;
		UINT32 new_samples, samples_left;
		UINT32 final_pos;
		INT32 lvol = voice->output_left;
		INT32 rvol = voice->output_right;
		
		/* skip if muted */
		if (voice->Muted)
			continue;

		/* quick out if we're not playing and we're at 0 */
		if (!voice->playing && curr == 0 && prev == 0)
		{
			/* make sure next sound plays immediately */
			voice->output_pos = FRAC_ONE;

			continue;
		}

		/* finish off the current sample */
		/* interpolate */
		for (i = 0; i < samples && voice->output_pos < FRAC_ONE; i++)
		{
			int interp_sample = (((INT32)prev * (FRAC_ONE - voice->output_pos)) + ((INT32)curr * voice->output_pos)) >> FRAC_BITS;
			ldest[i] += interp_sample * lvol;
			rdest[i] += interp_sample * rvol;
			voice->output_pos += voice->output_step;
		}

		/* if we're over, continue; otherwise, we're done */
		if (voice->output_pos >= FRAC_ONE)
			voice->output_pos -= FRAC_ONE;
		else
			continue;

		/* compute how many new samples we need */
		final_pos = voice->output_pos + (samples - i) * voice->output_step;
		new_samples = (final_pos + FRAC_ONE) >> FRAC_BITS;
		if (new_samples > MAX_SAMPLE_CHUNK)
			new_samples = MAX_SAMPLE_CHUNK;

		/* generate them into our buffer */
		switch (voice->playing << 7 | voice->mode)
		{
			case 0x81:  samples_left = generate_adpcm(chip, voice, chip->scratch, new_samples); break;
			case 0x82:  samples_left = generate_pcm8(chip, voice, chip->scratch, new_samples); break;
			case 0x83:  samples_left = generate_pcm16(chip, voice, chip->scratch, new_samples); break;
			default:    samples_left = 0; memset(chip->scratch, 0, new_samples * sizeof(chip->scratch[0])); break;
		}

		if (samples_left || voice->ended)
		{
			UINT32 base;
			UINT32 j;
			INT16 t;
			
			voice->ended = 0;
			base = new_samples - samples_left;
			t = (base == 0) ? curr : chip->scratch[base - 1];
			
			for (j = 0; j < samples_left; j++)
			{
				t = (t * 15) / 16;
				chip->scratch[base + j] = t;
			}

			/* if we hit the end and IRQs are enabled, signal it */
			if (base != 0)
			{
				voice->playing = 0;

				/* set update_irq_state_timer. IRQ is signaled on next CPU execution. */
				voice->irq_schedule = 1;
			}
		}

		/* advance forward one sample */
		prev = curr;
		curr = *curr_data++;

		/* then sample-rate convert with linear interpolation */
		while (i < samples)
		{
			/* interpolate */
			for (; i < samples && voice->output_pos < FRAC_ONE; i++)
			{
				int interp_sample = (((INT32)prev * (FRAC_ONE - voice->output_pos)) + ((INT32)curr * voice->output_pos)) >> FRAC_BITS;
				ldest[i] += interp_sample * lvol;
				rdest[i] += interp_sample * rvol;
				voice->output_pos += voice->output_step;
			}

			/* if we're over, grab the next samples */
			if (voice->output_pos >= FRAC_ONE)
			{
				voice->output_pos -= FRAC_ONE;
				prev = curr;
				curr = *curr_data++;
			}
		}

		/* remember the last samples */
		voice->last_sample = prev;
		voice->curr_sample = curr;
	}

	for (i = 0; i < samples; i++)
	{
		outputs[0][i] >>= 8;
		outputs[1][i] >>= 8;
	}
	
	for (v = 0; v < 8; v++)
		update_irq_state_timer_common(chip, v);
}